

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyAllElementsAndMatchersAreMatched
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  value_type pMVar1;
  bool bVar2;
  size_t sVar3;
  byte *pbVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference ppMVar7;
  ostream *poVar8;
  MatchResultListener *in_RCX;
  MatchMatrix *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  *in_RDI;
  size_t ei;
  char *outer_sep;
  char *sep_1;
  size_t mi;
  char *sep;
  char matched;
  size_t irhs;
  size_t ilhs;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  bool result;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  byte bVar9;
  MatchResultListener *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe88;
  MatchResultListener *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  ulong local_b8;
  ulong local_a0;
  size_type local_88;
  ulong local_80;
  allocator<char> local_72;
  undefined1 local_71;
  vector<char,_std::allocator<char>_> local_70;
  allocator<char> local_42;
  undefined1 local_41;
  vector<char,_std::allocator<char>_> local_40;
  byte local_21;
  MatchResultListener *local_20;
  MatchMatrix *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_21 = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  MatchMatrix::LhsSize(in_RDX);
  local_41 = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (value_type_conflict *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_42);
  MatchMatrix::RhsSize(local_18);
  local_71 = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (value_type_conflict *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_72);
  for (local_80 = 0; sVar3 = MatchMatrix::LhsSize(local_18), local_80 < sVar3;
      local_80 = local_80 + 1) {
    for (local_88 = 0; sVar3 = MatchMatrix::RhsSize(local_18), local_88 < sVar3;
        local_88 = local_88 + 1) {
      bVar2 = MatchMatrix::HasEdge
                        ((MatchMatrix *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                         (size_t)in_stack_fffffffffffffe80);
      pbVar4 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_80);
      *pbVar4 = *pbVar4 | bVar2;
      pbVar4 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&local_70,local_88);
      *pbVar4 = *pbVar4 | bVar2;
    }
  }
  for (local_a0 = 0; sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_70),
      local_a0 < sVar5; local_a0 = local_a0 + 1) {
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_70,local_a0);
    if (*pvVar6 == '\0') {
      local_21 = 0;
      bVar2 = MatchResultListener::IsInterested(local_20);
      if (bVar2) {
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (char **)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (char (*) [10])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (char (*) [3])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        ppMVar7 = std::
                  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ::operator[](in_RDI,local_a0);
        pMVar1 = *ppMVar7;
        poVar8 = MatchResultListener::stream(local_20);
        (*pMVar1->_vptr_MatcherDescriberInterface[2])(pMVar1,poVar8);
      }
    }
  }
  for (local_b8 = 0; sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_40),
      local_b8 < sVar5; local_b8 = local_b8 + 1) {
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_b8);
    if (*pvVar6 == '\0') {
      local_21 = 0;
      bVar2 = MatchResultListener::IsInterested(local_20);
      if (bVar2) {
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (char **)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (char **)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        in_stack_fffffffffffffe90 =
             MatchResultListener::operator<<
                       (in_stack_fffffffffffffe80,
                        (char (*) [10])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)
                       );
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        in_stack_fffffffffffffe80 =
             MatchResultListener::operator<<
                       (in_stack_fffffffffffffe80,
                        (char (*) [3])CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
        ;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_10,local_b8);
        MatchResultListener::operator<<
                  (in_stack_fffffffffffffe80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      }
    }
  }
  bVar9 = local_21;
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe90);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe90);
  return (bool)(bVar9 & 1);
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::
VerifyAllElementsAndMatchersAreMatched(
    const ::std::vector<string>& element_printouts,
    const MatchMatrix& matrix,
    MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}